

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

void __thiscall LinearSystem::RunReverseGauss(LinearSystem *this)

{
  pointer pOVar1;
  int iVar2;
  bool bVar3;
  Fraction *pFVar4;
  Fraction coefficient_00;
  int row;
  int iVar5;
  int row_00;
  Fraction coefficient;
  Fraction local_38;
  
  iVar5 = this->n_;
  if (this->m_ < this->n_) {
    iVar5 = this->m_;
  }
  if (0 < iVar5) {
    iVar2 = iVar5;
    do {
      iVar5 = iVar5 + -1;
      row_00 = iVar2 + -1;
      pFVar4 = ExtendedMatrix::At(&this->system_,row_00,row_00);
      Fraction::Fraction(&local_38,0);
      bVar3 = operator==(pFVar4,&local_38);
      if (!bVar3) {
        row = iVar5;
        if (1 < iVar2) {
          do {
            row = row + -1;
            pFVar4 = ExtendedMatrix::At(&this->system_,row,row_00);
            local_38 = *pFVar4;
            coefficient_00 = Fraction::operator-(&local_38);
            PerformOperation(this,AddRow,row,row_00,coefficient_00);
          } while (0 < row);
        }
        pOVar1 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_start != pOVar1) &&
           (pOVar1[-1].operation_type != MainOutput)) {
          std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::
          emplace_back<>(&this->history_);
        }
      }
      bVar3 = 1 < iVar2;
      iVar2 = row_00;
    } while (bVar3);
  }
  return;
}

Assistant:

bool LinearSystem::ApplyOperation(const Operation& operation) {
  return ApplyOperation(operation.operation_type, operation.lhs, operation.rhs,
      operation.coefficient);
}